

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * google::protobuf::anon_unknown_1::ToCamelCase
                   (string *__return_storage_ptr__,string *input,bool lower_first)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char cVar4;
  ulong uVar5;
  bool bVar6;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (input->_M_string_length != 0) {
    bVar6 = !lower_first;
    uVar5 = 0;
    do {
      bVar3 = true;
      if ((input->_M_dataplus)._M_p[uVar5] != '_') {
        if (bVar6) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          bVar3 = false;
        }
        else {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          bVar3 = bVar6;
        }
      }
      bVar6 = bVar3;
      uVar5 = uVar5 + 1;
    } while (uVar5 < input->_M_string_length);
  }
  if ((lower_first) && (__return_storage_ptr__->_M_string_length != 0)) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    cVar1 = *pcVar2;
    cVar4 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar4 = cVar1;
    }
    *pcVar2 = cVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

string ToCamelCase(const string& input, bool lower_first) {
  bool capitalize_next = !lower_first;
  string result;
  result.reserve(input.size());

  for (int i = 0; i < input.size(); i++) {
    if (input[i] == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(ToUpper(input[i]));
      capitalize_next = false;
    } else {
      result.push_back(input[i]);
    }
  }

  // Lower-case the first letter.
  if (lower_first && !result.empty()) {
    result[0] = ToLower(result[0]);
  }

  return result;
}